

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

qsizetype __thiscall QBitArray::count(QBitArray *this,bool on)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong *puVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  
  pcVar1 = (this->d).d.ptr;
  lVar2 = (this->d).d.size;
  pcVar4 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar4 = "";
  }
  puVar6 = (ulong *)(pcVar4 + 1);
  puVar7 = (ulong *)(pcVar1 + lVar2);
  if (puVar7 < pcVar4 + 8) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    puVar5 = puVar6;
    do {
      puVar6 = puVar5 + 1;
      uVar10 = *puVar5 - (*puVar5 >> 1 & 0x5555555555555555);
      uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
      lVar3 = lVar3 + (((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      puVar9 = (ulong *)((long)puVar5 + 0xf);
      puVar5 = puVar6;
    } while (puVar9 <= puVar7);
  }
  if ((ulong *)((long)puVar6 + 3U) <= puVar7) {
    uVar10 = *puVar6;
    puVar6 = (ulong *)((long)puVar6 + 4);
    uVar8 = (uint)uVar10 - ((uint)uVar10 >> 1 & 0x55555555);
    uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333);
    lVar3 = lVar3 + (ulong)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f) * 0x1010101 >> 0x18);
  }
  if ((ulong *)((long)puVar6 + 1U) < puVar7) {
    uVar10 = *puVar6;
    puVar6 = (ulong *)((long)puVar6 + 2);
    uVar8 = (uint)(ushort)uVar10 - ((ushort)((ushort)uVar10 >> 1) & 0x5555);
    uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333);
    uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f;
    lVar3 = lVar3 + (ulong)((uVar8 >> 8) + uVar8 & 0xff);
  }
  if (puVar6 < puVar7) {
    lVar3 = lVar3 + (ulong)(((uint)(byte)*puVar6 * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c
                           );
  }
  if (!on) {
    lVar3 = lVar2 * 8 - (lVar3 + *pcVar4);
  }
  return lVar3;
}

Assistant:

const T *data() const noexcept { return ptr; }